

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::anon_unknown_39::lookupDownward
               (span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>
                nameParts,NameComponents name,ASTContext *context,
               bitmask<slang::ast::LookupFlags> flags,LookupResult *result)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view arg_03;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors;
  span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  bitmask<slang::ast::LookupResultFlags> bVar4;
  pointer pNVar5;
  InstanceSymbol *pIVar6;
  DefinitionSymbol *pDVar7;
  Scope *pSVar8;
  SourceLocation startLoc;
  SourceLocation endLoc;
  GenerateBlockSymbol *pGVar9;
  SymbolMap *pSVar10;
  pointer ppVar11;
  LookupResult *this;
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  *this_00;
  VariableSymbol *pVVar12;
  Symbol *pSVar13;
  undefined8 in_RDX;
  SourceLocation in_R8;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  Diagnostic *diag_2;
  DefinitionSymbol *def;
  Diagnostic *diag_1;
  const_iterator scopeIt;
  SymbolMap *nameMap;
  Symbol *prevSym;
  Scope *scope;
  SourceRange errorRange_1;
  InstanceBodySymbol *body;
  Diagnostic *diag;
  DiagCode code;
  bool isType;
  InterfacePortSymbol *ifacePort;
  ModportSymbol *modport;
  SourceRange errorRange;
  bool isCBOrVirtualIface;
  NameComponents *memberName;
  anon_class_24_3_37526af6 isValueLike;
  reverse_iterator it;
  bool isVirtualIface;
  anon_class_24_3_69c2c931 checkClassParams;
  Symbol *symbol;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  MemberSelector *in_stack_fffffffffffffa88;
  Diagnostic *in_stack_fffffffffffffa90;
  SourceLocation in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  DiagCode in_stack_fffffffffffffaa4;
  SourceLocation in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  DiagCode in_stack_fffffffffffffab4;
  uint uVar14;
  SourceLocation in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffac0;
  DiagCode DVar15;
  Diagnostic *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  undefined1 uVar16;
  Scope *in_stack_fffffffffffffae8;
  NameComponents *in_stack_fffffffffffffaf0;
  anon_class_24_3_69c2c931 *in_stack_fffffffffffffaf8;
  byte local_4c1;
  LookupResult *in_stack_fffffffffffffb78;
  ASTContext *in_stack_fffffffffffffb80;
  undefined2 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8a;
  bitmask<slang::ast::LookupResultFlags> in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  pointer in_stack_fffffffffffffb90;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb98;
  SourceRange local_338;
  undefined8 local_328;
  undefined8 local_320;
  InstanceBodySymbol *local_318;
  SourceLocation local_300;
  undefined4 local_2f4;
  SourceLocation local_2e0;
  SourceLocation local_2d8;
  SourceLocation local_2c0;
  DiagCode local_2b4;
  Diagnostic *local_2b0;
  DiagCode local_2a6;
  byte local_2a1;
  IfaceConn local_290;
  InterfacePortSymbol *local_280;
  long local_278;
  bitmask<slang::ast::LookupResultFlags> local_269;
  SourceLocation local_268;
  SourceLocation local_260;
  undefined4 local_254;
  SourceLocation local_240;
  SourceLocation local_238;
  SourceRange local_230;
  bitmask<slang::ast::LookupFlags> local_220;
  bitmask<slang::ast::LookupResultFlags> local_21a;
  bitmask<slang::ast::LookupResultFlags> local_219 [16];
  byte local_209;
  undefined8 local_208;
  undefined8 local_200;
  size_t local_1f0;
  char *local_1e8;
  SourceLocation local_1e0;
  SourceLocation local_1d8;
  SourceLocation local_1d0;
  pointer local_198;
  byte *local_188;
  undefined8 local_180;
  basic_string_view<char,_std::char_traits<char>_> *local_178;
  byte local_159;
  InstanceBodySymbol **local_158;
  SourceLocation local_150;
  undefined8 local_148;
  undefined8 local_140;
  InstanceBodySymbol *local_138;
  SourceLocation local_130;
  undefined8 local_128;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  SymbolMap *local_f8;
  char_pointer local_f0;
  table_element_pointer local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d0;
  SymbolMap *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
  local_b0;
  basic_string_view<char,_std::char_traits<char>_> *local_98;
  SymbolMap *local_90;
  iterator local_88;
  size_t local_78;
  basic_string_view<char,_std::char_traits<char>_> *local_70;
  SymbolMap *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  SymbolMap *local_8;
  
  local_140 = 0;
  local_130 = in_R8;
  local_128 = in_RDX;
  local_138 = (InstanceBodySymbol *)
              std::exchange<slang::ast::Symbol_const*,decltype(nullptr)>
                        ((Symbol **)in_stack_fffffffffffffa90,(void **)in_stack_fffffffffffffa88);
  local_158 = &local_138;
  local_150 = local_130;
  local_148 = local_128;
  local_159 = 0;
  std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::rbegin
            ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *)
             in_stack_fffffffffffffa98);
  while( true ) {
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::rend
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffffa98);
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffa98);
    DVar15 = SUB84((ulong)in_stack_fffffffffffffac0 >> 0x20,0);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_00719429;
    bVar2 = lookupDownward::anon_class_24_3_69c2c931::operator()
                      (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    if (!bVar2) {
      return false;
    }
    local_188 = &local_159;
    local_180 = local_128;
    local_178 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
    bVar2 = lookupDownward::anon_class_24_3_37526af6::operator()
                      ((anon_class_24_3_37526af6 *)in_stack_fffffffffffffab8,
                       (Symbol **)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
    if (bVar2) break;
    local_4c1 = 1;
    if ((local_138->super_Symbol).kind != ClockingBlock) {
      local_4c1 = local_159;
    }
    local_209 = local_4c1 & 1;
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::rbegin
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffffa98);
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffa98);
    if (bVar2) {
      if ((local_138->super_Symbol).kind == InterfacePort) {
        bitmask<slang::ast::LookupResultFlags>::bitmask(local_219,IfacePort);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)local_130 + 0x14),local_219);
        SmallVectorBase<slang::ast::HierarchicalReference::Element>::
        emplace_back<slang::ast::Symbol_const&>
                  ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
                   in_stack_fffffffffffffa98,(Symbol *)in_stack_fffffffffffffa90);
      }
      else if ((((local_138->super_Symbol).kind != Package) &&
               ((local_138->super_Symbol).kind != CompilationUnit)) && ((local_209 & 1) == 0)) {
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_21a,IsHierarchical);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)local_130 + 0x14),&local_21a);
        SmallVectorBase<slang::ast::HierarchicalReference::Element>::
        emplace_back<slang::ast::Symbol_const&>
                  ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
                   in_stack_fffffffffffffa98,(Symbol *)in_stack_fffffffffffffa90);
      }
    }
    else {
      bitmask<slang::ast::LookupFlags>::bitmask(&local_220,IfacePortConn);
      bVar3 = bitmask<slang::ast::LookupFlags>::has
                        ((bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffa90,
                         (bitmask<slang::ast::LookupFlags> *)in_stack_fffffffffffffa88);
      DVar15 = SUB84((ulong)in_stack_fffffffffffffac0 >> 0x20,0);
      bVar2 = false;
      if (((bVar3) && (bVar2 = true, (local_138->super_Symbol).kind != GenerateBlock)) &&
         (bVar2 = true, (local_138->super_Symbol).kind != GenerateBlockArray)) {
        bVar2 = (local_138->super_Symbol).kind == InstanceArray;
      }
      if (bVar2) {
        local_238 = SourceRange::start((SourceRange *)&stack0x00000018);
        std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
        rend((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *)
             in_stack_fffffffffffffa98);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
        ::operator-((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffaa8,
                    CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
        pNVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffa90);
        local_240 = SourceRange::end(&(pNVar5->name).range);
        SourceRange::SourceRange(&local_230,local_238,local_240);
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x718529);
        local_254 = 0x13000a;
        local_268 = local_230.startLoc;
        local_260 = local_230.endLoc;
        sourceRange.startLoc._4_2_ = in_stack_fffffffffffffab4.subsystem;
        sourceRange.startLoc._6_2_ = in_stack_fffffffffffffab4.code;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffffab0;
        sourceRange.endLoc = in_stack_fffffffffffffab8;
        LookupResult::addDiag
                  ((LookupResult *)in_stack_fffffffffffffaa8,
                   (Scope *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),DVar15,
                   sourceRange);
        return false;
      }
      if ((local_209 & 1) == 0) {
        bitmask<slang::ast::LookupResultFlags>::bitmask(&local_269,IsHierarchical);
        bitmask<slang::ast::LookupResultFlags>::operator|=
                  ((bitmask<slang::ast::LookupResultFlags> *)((long)local_130 + 0x14),&local_269);
        SmallVectorBase<slang::ast::HierarchicalReference::Element>::
        emplace_back<slang::ast::Symbol_const&>
                  ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
                   in_stack_fffffffffffffa98,(Symbol *)in_stack_fffffffffffffa90);
      }
    }
    local_278 = 0;
    if ((local_138->super_Symbol).kind == InterfacePort) {
      local_280 = Symbol::as<slang::ast::InterfacePortSymbol>((Symbol *)0x718605);
      local_290 = InterfacePortSymbol::getConnection
                            ((InterfacePortSymbol *)in_stack_fffffffffffffa98);
      std::tie<slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                ((Symbol **)in_stack_fffffffffffffa98,(ModportSymbol **)in_stack_fffffffffffffa90);
      std::tuple<slang::ast::Symbol_const*&,slang::ast::ModportSymbol_const*&>::operator=
                ((tuple<const_slang::ast::Symbol_*&,_const_slang::ast::ModportSymbol_*&> *)
                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                 in_stack_fffffffffffffa98);
      if (local_138 == (InstanceBodySymbol *)0x0) {
        return false;
      }
    }
    bVar2 = Symbol::isScope((Symbol *)0x718683);
    if ((((!bVar2) && ((local_138->super_Symbol).kind != Instance)) ||
        (bVar2 = Symbol::isType((Symbol *)0x7186a1), bVar2)) ||
       ((local_138->super_Symbol).kind == Checker)) {
      if ((local_138->super_Symbol).kind == UninstantiatedDef) {
        return false;
      }
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x7186dd);
      local_138 = (InstanceBodySymbol *)
                  unwrapTypeParam((Scope *)in_stack_fffffffffffffa98,
                                  (Symbol *)in_stack_fffffffffffffa90);
      if (local_138 != (InstanceBodySymbol *)0x0) {
        bVar2 = Symbol::isType((Symbol *)0x71871a);
        if (bVar2) {
          local_2a1 = 1;
          Symbol::as<slang::ast::Type>((Symbol *)0x718735);
          bVar2 = Type::isError((Type *)0x71873d);
          if (bVar2) {
            return false;
          }
        }
        else {
          local_2a1 = (local_138->super_Symbol).kind == GenericClassDef;
        }
        DiagCode::DiagCode(&local_2a6);
        if ((local_2a1 & 1) == 0) {
          if (((local_138->super_Symbol).kind == Checker) ||
             ((local_138->super_Symbol).kind == CheckerInstance)) {
            local_2a6.subsystem = Lookup;
            local_2a6.code = 3;
          }
          else {
            local_2a6.subsystem = Lookup;
            local_2a6.code = 0x21;
          }
        }
        else {
          local_2a6.subsystem = Lookup;
          local_2a6.code = 9;
        }
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x7187e4);
        local_2b4 = local_2a6;
        pNVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffa90);
        local_2c0 = pNVar5->dotLocation;
        local_2b0 = LookupResult::addDiag
                              ((LookupResult *)
                               CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                               (Scope *)in_stack_fffffffffffffa98,in_stack_fffffffffffffab4,
                               in_stack_fffffffffffffaa8);
        range.endLoc._0_4_ = in_stack_fffffffffffffaa0;
        range.startLoc = in_stack_fffffffffffffa98;
        range.endLoc._4_2_ = in_stack_fffffffffffffaa4.subsystem;
        range.endLoc._6_2_ = in_stack_fffffffffffffaa4.code;
        Diagnostic::operator<<(in_stack_fffffffffffffa90,range);
        pNVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffa90);
        local_2e0 = (pNVar5->name).range.startLoc;
        local_2d8 = (pNVar5->name).range.endLoc;
        range_00.endLoc._0_4_ = in_stack_fffffffffffffaa0;
        range_00.startLoc = in_stack_fffffffffffffa98;
        range_00.endLoc._4_2_ = in_stack_fffffffffffffaa4.subsystem;
        range_00.endLoc._6_2_ = in_stack_fffffffffffffaa4.code;
        Diagnostic::operator<<(in_stack_fffffffffffffa90,range_00);
        if ((local_2a1 & 1) == 0) {
          arg._M_str._0_7_ = in_stack_fffffffffffffae0;
          arg._M_len = in_stack_fffffffffffffad8;
          arg._M_str._7_1_ = in_stack_fffffffffffffae7;
          Diagnostic::operator<<(in_stack_fffffffffffffad0,arg);
        }
        local_2f4 = 0x50001;
        local_300 = (local_138->super_Symbol).location;
        Diagnostic::addNote(in_stack_fffffffffffffa90,in_stack_fffffffffffffaa4,
                            in_stack_fffffffffffffa98);
        return true;
      }
      return false;
    }
    bVar2 = std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::
            empty((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
                  0x718972);
    if ((!bVar2) &&
       (selectors._M_extent._M_extent_value = in_stack_fffffffffffffb98._M_extent_value,
       selectors._M_ptr = in_stack_fffffffffffffb90,
       local_138 = (InstanceBodySymbol *)
                   Lookup::selectChild((Symbol *)
                                       CONCAT17(in_stack_fffffffffffffb8f,
                                                CONCAT16(in_stack_fffffffffffffb8e.m_bits,
                                                         CONCAT42(in_stack_fffffffffffffb8a,
                                                                  in_stack_fffffffffffffb88))),
                                       selectors,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                                      ), local_138 == (InstanceBodySymbol *)0x0)) {
      return false;
    }
    if ((local_138->super_Symbol).kind == Instance) {
      pIVar6 = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x718a03);
      local_318 = pIVar6->body;
      local_138 = local_318;
      if (local_278 != 0) {
        local_328 = *(undefined8 *)(local_278 + 8);
        local_320 = *(undefined8 *)(local_278 + 0x10);
        name_00._M_str = (char *)in_stack_fffffffffffffaf8;
        name_00._M_len = (size_t)in_stack_fffffffffffffaf0;
        local_138 = (InstanceBodySymbol *)Scope::find(in_stack_fffffffffffffae8,name_00);
      }
      pDVar7 = InstanceBodySymbol::getDefinition(local_318);
      if (pDVar7->definitionKind == Program) {
        pSVar8 = not_null<const_slang::ast::Scope_*>::operator->
                           ((not_null<const_slang::ast::Scope_*> *)0x718a9b);
        Scope::asSymbol(pSVar8);
        bVar2 = isInProgram((Symbol *)in_stack_fffffffffffffa98);
        if (!bVar2) {
          startLoc = SourceRange::start((SourceRange *)&stack0x00000018);
          std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::
          rend((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffffa98);
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
          ::operator-((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffaa8,
                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
          pNVar5 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                                 *)in_stack_fffffffffffffa90);
          endLoc = SourceRange::end(&(pNVar5->name).range);
          SourceRange::SourceRange(&local_338,startLoc,endLoc);
          not_null<const_slang::ast::Scope_*>::operator*
                    ((not_null<const_slang::ast::Scope_*> *)0x718b56);
          sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffab4.subsystem;
          sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffffab4.code;
          sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffab0;
          sourceRange_00.endLoc = in_stack_fffffffffffffab8;
          LookupResult::addDiag
                    ((LookupResult *)in_stack_fffffffffffffaa8,
                     (Scope *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                     SUB84((ulong)in_stack_fffffffffffffac0 >> 0x20,0),sourceRange_00);
        }
      }
    }
    else if (((local_138->super_Symbol).kind == GenerateBlock) &&
            (pGVar9 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x718bc6),
            (pGVar9->isUninstantiated & 1U) != 0)) {
      return true;
    }
    pNVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffffa90);
    memcpy((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008,pNVar5,0x38);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
    if (bVar2) {
      return false;
    }
    pSVar8 = Symbol::as<slang::ast::Scope>((Symbol *)0x718c2a);
    name_01._M_str = (char *)in_stack_fffffffffffffaf8;
    name_01._M_len = (size_t)in_stack_fffffffffffffaf0;
    local_138 = (InstanceBodySymbol *)Scope::find(in_stack_fffffffffffffae8,name_01);
    if (local_138 == (InstanceBodySymbol *)0x0) {
      pSVar13 = Scope::asSymbol(pSVar8);
      if (pSVar13->kind == Modport) {
        Symbol::getParentScope(pSVar13);
        name_02._M_str = (char *)in_stack_fffffffffffffaf8;
        name_02._M_len = (size_t)in_stack_fffffffffffffaf0;
        local_138 = (InstanceBodySymbol *)Scope::find(in_stack_fffffffffffffae8,name_02);
        if (local_138 != (InstanceBodySymbol *)0x0) {
          bVar2 = SemanticFacts::isAllowedInModport((local_138->super_Symbol).kind);
          DVar15 = SUB84((ulong)in_stack_fffffffffffffac0 >> 0x20,0);
          if ((bVar2) || ((local_138->super_Symbol).kind == Modport)) {
            Symbol::getDeclaringDefinition((Symbol *)in_stack_fffffffffffffa98);
            not_null<const_slang::ast::Scope_*>::operator*
                      ((not_null<const_slang::ast::Scope_*> *)0x7192ea);
            sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffffab4.subsystem;
            sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffffab4.code;
            sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffffab0;
            sourceRange_01.endLoc = local_130;
            LookupResult::addDiag
                      ((LookupResult *)in_stack_fffffffffffffaa8,
                       (Scope *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),DVar15
                       ,sourceRange_01);
            arg_01._M_str._0_7_ = in_stack_fffffffffffffae0;
            arg_01._M_len = in_stack_fffffffffffffad8;
            arg_01._M_str._7_1_ = in_stack_fffffffffffffae7;
            Diagnostic::operator<<(in_stack_fffffffffffffad0,arg_01);
            arg_02._M_str._0_7_ = in_stack_fffffffffffffae0;
            arg_02._M_len = in_stack_fffffffffffffad8;
            arg_02._M_str._7_1_ = in_stack_fffffffffffffae7;
            Diagnostic::operator<<(in_stack_fffffffffffffad0,arg_02);
            arg_03._M_str._0_7_ = in_stack_fffffffffffffae0;
            arg_03._M_len = in_stack_fffffffffffffad8;
            arg_03._M_str._7_1_ = in_stack_fffffffffffffae7;
            Diagnostic::operator<<(in_stack_fffffffffffffad0,arg_03);
            return false;
          }
          goto LAB_0071940b;
        }
      }
      pSVar10 = Scope::getNameMap((Scope *)in_stack_fffffffffffffa90);
      local_100 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
      local_f8 = pSVar10;
      local_d0 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
      local_c8 = pSVar10;
      local_98 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
      local_90 = pSVar10;
      local_70 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008;
      local_68 = pSVar10;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                 ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                             *)in_stack_fffffffffffffa90,&in_stack_fffffffffffffa88->name);
      pbVar1 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                                 *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
      local_10 = pbVar1;
      local_20 = local_78;
      local_8 = pSVar10;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      goto LAB_00718e33;
    }
LAB_0071940b:
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                  *)in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
  }
  SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  ::
  append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
            ((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
              *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             (span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffa98);
  while( true ) {
    std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>::rend
              ((span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> *
               )in_stack_fffffffffffffa98);
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffa98);
    DVar15 = SUB84((ulong)in_stack_fffffffffffffac0 >> 0x20,0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_198 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                              *)in_stack_fffffffffffffa90);
    local_1f0 = (local_198->name).text._M_len;
    local_1e8 = (local_198->name).text._M_str;
    pNVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffffa90);
    local_1e0 = pNVar5->dotLocation;
    local_1d8 = (local_198->name).range.startLoc;
    local_1d0 = (local_198->name).range.endLoc;
    std::variant<slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
    ::
    variant<slang::ast::LookupResult::MemberSelector,void,void,slang::ast::LookupResult::MemberSelector,void>
              ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    ::push_back((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                 *)in_stack_fffffffffffffa90,
                (variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                 *)in_stack_fffffffffffffa88);
    SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    ::
    append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
              ((SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffa98);
    bVar2 = lookupDownward::anon_class_24_3_69c2c931::operator()
                      (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
    if (!bVar2) {
      return false;
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                  *)in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20));
  }
  std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
             0x71829a);
  in_stack_00000028 = local_208;
  in_stack_00000030 = local_200;
LAB_00719429:
  bVar2 = lookupDownward::anon_class_24_3_69c2c931::operator()
                    (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  if (!bVar2) {
    return false;
  }
  this = (LookupResult *)((long)local_130 + 0x14);
  bVar4 = ast::operator|(None,None);
  bVar2 = bitmask<slang::ast::LookupResultFlags>::has
                    ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffa90,
                     (bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffa88);
  this_00 = (SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
             *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0);
  uVar14 = (uint)in_stack_fffffffffffffab4 & 0xffffff;
  if (bVar2) {
    uVar14 = CONCAT13(local_138 != (InstanceBodySymbol *)0x0,in_stack_fffffffffffffab4._0_3_);
  }
  if ((char)(uVar14 >> 0x18) != '\0') {
    this_00 = (SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               *)((long)local_130 + 0x14);
    bitmask<slang::ast::LookupResultFlags>::bitmask
              ((bitmask<slang::ast::LookupResultFlags> *)&stack0xfffffffffffffb8e,IsHierarchical);
    bVar2 = bitmask<slang::ast::LookupResultFlags>::has
                      ((bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffa90,
                       (bitmask<slang::ast::LookupResultFlags> *)in_stack_fffffffffffffa88);
    if (bVar2) {
      bVar2 = VariableSymbol::isKind((local_138->super_Symbol).kind);
      if ((bVar2) &&
         (pVVar12 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x719517),
         pVVar12->lifetime == Automatic)) {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x71953a);
        sourceRange_02.startLoc._4_4_ = uVar14;
        sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffffab0;
        sourceRange_02.endLoc = in_stack_fffffffffffffab8;
        LookupResult::addDiag(this,(Scope *)this_00,DVar15,sourceRange_02);
        return false;
      }
      bVar2 = Symbol::isType((Symbol *)0x7195a5);
      if (bVar2) {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x7195c5);
        sourceRange_03.startLoc._4_4_ = uVar14;
        sourceRange_03.startLoc._0_4_ = in_stack_fffffffffffffab0;
        sourceRange_03.endLoc = in_stack_fffffffffffffab8;
        LookupResult::addDiag(this,(Scope *)this_00,DVar15,sourceRange_03);
        return false;
      }
    }
    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
    emplace_back<slang::ast::Symbol_const&>
              ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)
               in_stack_fffffffffffffa98,(Symbol *)in_stack_fffffffffffffa90);
  }
  *(InstanceBodySymbol **)local_130 = local_138;
  bVar2 = std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>
                      *)0x719667);
  if (!bVar2) {
    if (((*(long *)local_130 == 0) || (bVar2 = Symbol::isScope((Symbol *)0x719691), !bVar2)) ||
       (bVar2 = Symbol::isType((Symbol *)0x7196a7), bVar2)) {
      SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      ::
      append_range<std::span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>_>
                (this_00,(span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL>
                          *)in_stack_fffffffffffffa98);
    }
    else {
      selectors_00._M_extent._M_extent_value = in_stack_fffffffffffffb98._M_extent_value;
      selectors_00._M_ptr = in_stack_fffffffffffffb90;
      pSVar13 = Lookup::selectChild((Symbol *)
                                    CONCAT17(bVar4.m_bits,
                                             CONCAT16(in_stack_fffffffffffffb8e.m_bits,
                                                      CONCAT42(in_stack_fffffffffffffb8a,
                                                               in_stack_fffffffffffffb88))),
                                    selectors_00,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                                   );
      *(Symbol **)local_130 = pSVar13;
    }
  }
  return true;
LAB_00718e33:
  local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
  local_40 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
             ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                       *)0x718e55);
  local_40 = local_40 + local_38;
  local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             match((group15<boost::unordered::detail::foa::plain_integral> *)
                   in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
  if (local_44 != 0) {
    local_50 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
               ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
                           *)0x718ea3);
    local_58 = local_50 + local_38 * 0xf;
    do {
      local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
      ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
              *)0x718ef6);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>
                ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>
                  *)0x718f23);
      bVar2 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffaa8,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
      if (bVar2) {
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
        ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
        goto LAB_0071901a;
      }
      local_44 = local_44 - 1 & local_44;
    } while (local_44 != 0);
  }
  bVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
  if (bVar2) {
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
    ::table_locator(&local_b0);
    goto LAB_0071901a;
  }
  bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                    (&local_30,
                     (pSVar10->table_).
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                     .arrays.groups_size_mask);
  if (!bVar2) {
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>
    ::table_locator(&local_b0);
LAB_0071901a:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
               ::make_iterator((locator *)0x719027);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_f0 = local_c0.pc_;
    local_e8 = local_c0.p_;
    boost::unordered::
    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
           *)0x7190b9);
    bVar2 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffa90,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffa88);
    uVar16 = false;
    if (bVar2) {
      ppVar11 = boost::unordered::detail::foa::
                table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)in_stack_fffffffffffffa90);
      uVar16 = ppVar11->second->kind == MethodPrototype;
    }
    if ((bool)uVar16 == false) {
      if ((pSVar13->kind == GenerateBlockArray) || (pSVar13->kind == InstanceArray)) {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x719153);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffa90);
        LookupResult::addDiag
                  ((LookupResult *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (Scope *)in_stack_fffffffffffffa98,in_stack_fffffffffffffab4,
                   in_stack_fffffffffffffaa8);
      }
      else {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0x7191bb);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::ast::(anonymous_namespace)::NamePlusLoc_*,_std::span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffa90);
        LookupResult::addDiag
                  ((LookupResult *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (Scope *)in_stack_fffffffffffffa98,in_stack_fffffffffffffab4,
                   in_stack_fffffffffffffaa8);
        arg_00._M_str._0_7_ = in_stack_fffffffffffffae0;
        arg_00._M_len = in_stack_fffffffffffffad8;
        arg_00._M_str._7_1_ = uVar16;
        Diagnostic::operator<<(in_stack_fffffffffffffad0,arg_00);
        range_01.endLoc._0_4_ = in_stack_fffffffffffffaa0;
        range_01.startLoc = in_stack_fffffffffffffa98;
        range_01.endLoc._4_2_ = in_stack_fffffffffffffaa4.subsystem;
        range_01.endLoc._6_2_ = in_stack_fffffffffffffaa4.code;
        Diagnostic::operator<<(in_stack_fffffffffffffa90,range_01);
      }
      return true;
    }
    return false;
  }
  goto LAB_00718e33;
}

Assistant:

bool lookupDownward(std::span<const NamePlusLoc> nameParts, NameComponents name,
                    const ASTContext& context, bitmask<LookupFlags> flags, LookupResult& result) {
    const Symbol* symbol = std::exchange(result.found, nullptr);
    SLANG_ASSERT(symbol);

    // Helper function to check whether class parameter assignments have been
    // incorrectly supplied for a non-class symbol.
    auto checkClassParams = [&](const NameComponents& nc) {
        if (symbol && symbol->kind != SymbolKind::GenericClassDef && nc.paramAssignments) {
            auto& diag = result.addDiag(*context.scope, diag::NotAGenericClass,
                                        nc.paramAssignments->getFirstToken().location());
            diag << nc.range;
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return false;
        }
        return true;
    };

    // Loop through each dotted name component and try to find it in the preceeding scope.
    bool isVirtualIface = false;
    for (auto it = nameParts.rbegin(); it != nameParts.rend(); it++) {
        if (!checkClassParams(name))
            return false;

        auto isValueLike = [&](const Symbol*& symbol) {
            switch (symbol->kind) {
                case SymbolKind::ConstraintBlock:
                case SymbolKind::Coverpoint:
                case SymbolKind::CoverCross:
                case SymbolKind::Sequence:
                case SymbolKind::Property:
                case SymbolKind::LetDecl:
                case SymbolKind::AssertionPort:
                    return true;
                default: {
                    if (!symbol->isValue())
                        return false;

                    // If this is a virtual interface value we should unwrap to
                    // the target interface and continue the hierarchical lookup.
                    auto& type = symbol->as<ValueSymbol>().getType();
                    if (type.isVirtualInterface()) {
                        isVirtualIface = true;
                        context.getCompilation().noteReference(*symbol);
                        symbol = getVirtualInterfaceTarget(type, context, name.range);
                        return false;
                    }

                    return true;
                }
            }
        };

        // If we found a value, the remaining dots are member access expressions.
        if (isValueLike(symbol)) {
            result.selectors.append_range(name.selectors);

            for (; it != nameParts.rend(); it++) {
                auto& memberName = it->name;
                result.selectors.push_back(LookupResult::MemberSelector{
                    memberName.text, it->dotLocation, memberName.range});

                result.selectors.append_range(memberName.selectors);

                if (!checkClassParams(memberName))
                    return false;
            }

            // Break out to return the symbol.
            name.selectors = {};
            break;
        }

        // This is a hierarchical lookup if we previously decided it was hierarchical, or:
        // - This is not a clocking block access
        // - This is not a virtual interface access (or descended from one)
        // - This is not a direct interface port, package, or $unit reference
        const bool isCBOrVirtualIface = symbol->kind == SymbolKind::ClockingBlock || isVirtualIface;
        if (it == nameParts.rbegin()) {
            if (symbol->kind == SymbolKind::InterfacePort) {
                result.flags |= LookupResultFlags::IfacePort;
                result.path.emplace_back(*symbol);
            }
            else if (symbol->kind != SymbolKind::Package &&
                     symbol->kind != SymbolKind::CompilationUnit && !isCBOrVirtualIface) {
                result.flags |= LookupResultFlags::IsHierarchical;
                result.path.emplace_back(*symbol);
            }
        }
        else if (flags.has(LookupFlags::IfacePortConn) &&
                 (symbol->kind == SymbolKind::GenerateBlock ||
                  symbol->kind == SymbolKind::GenerateBlockArray ||
                  symbol->kind == SymbolKind::InstanceArray)) {
            SourceRange errorRange{name.range.start(), (nameParts.rend() - 1)->name.range.end()};
            result.addDiag(*context.scope, diag::InvalidHierarchicalIfacePortConn, errorRange);
            return false;
        }
        else if (!isCBOrVirtualIface) {
            result.flags |= LookupResultFlags::IsHierarchical;
            result.path.emplace_back(*symbol);
        }

        const ModportSymbol* modport = nullptr;
        if (symbol->kind == SymbolKind::InterfacePort) {
            auto& ifacePort = symbol->as<InterfacePortSymbol>();
            std::tie(symbol, modport) = ifacePort.getConnection();
            if (!symbol)
                return false;
        }

        if ((!symbol->isScope() && symbol->kind != SymbolKind::Instance) || symbol->isType() ||
            symbol->kind == SymbolKind::Checker) {
            // If we found an uninstantiated def, exit silently. An appropriate error was
            // already issued, so no need to pile on.
            if (symbol->kind == SymbolKind::UninstantiatedDef)
                return false;

            symbol = unwrapTypeParam(*context.scope, symbol);
            if (!symbol)
                return false;

            bool isType;
            if (symbol->isType()) {
                isType = true;
                if (symbol->as<Type>().isError())
                    return false;
            }
            else {
                isType = symbol->kind == SymbolKind::GenericClassDef;
            }

            DiagCode code;
            if (isType) {
                code = diag::DotOnType;
            }
            else if (symbol->kind == SymbolKind::Checker ||
                     symbol->kind == SymbolKind::CheckerInstance) {
                code = diag::CheckerHierarchical;
            }
            else {
                code = diag::NotAHierarchicalScope;
            }

            auto& diag = result.addDiag(*context.scope, code, it->dotLocation);
            diag << name.range;
            diag << it->name.range;

            if (!isType)
                diag << name.text;

            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return true;
        }

        if (!name.selectors.empty()) {
            symbol = Lookup::selectChild(*symbol, name.selectors, context, result);
            if (!symbol)
                return false;
        }

        if (symbol->kind == SymbolKind::Instance) {
            auto& body = symbol->as<InstanceSymbol>().body;
            symbol = &body;

            // If we had a modport restriction on an interface port lookup
            // we should switch to doing the next lookup in that modport's scope.
            // We need to re-lookup the modport symbol because the one we have
            // is just representative; the real one depends on the result of the
            // selectChild call we made above in the case of an interface array.
            if (modport) {
                symbol = body.find(modport->name);
                SLANG_ASSERT(symbol);
            }

            // If we're descending into a program instance, verify that
            // the original scope for the lookup is also within a program.
            if (body.getDefinition().definitionKind == DefinitionKind::Program &&
                !isInProgram(context.scope->asSymbol())) {
                SourceRange errorRange{name.range.start(),
                                       (nameParts.rend() - 1)->name.range.end()};
                result.addDiag(*context.scope, diag::IllegalReferenceToProgramItem, errorRange);
            }
        }
        else if (symbol->kind == SymbolKind::GenerateBlock &&
                 symbol->as<GenerateBlockSymbol>().isUninstantiated) {
            // Don't allow lookups into uninstantiated generate blocks, but do return
            // true so that the lookup can continue elsewhere.
            return true;
        }

        name = it->name;
        if (name.text.empty())
            return false;

        auto& scope = symbol->as<Scope>();
        symbol = scope.find(name.text);
        if (!symbol) {
            // If we did the lookup in a modport, check to see if the symbol actually
            // exists in the parent interface.
            auto& prevSym = scope.asSymbol();
            if (prevSym.kind != SymbolKind::Modport ||
                (symbol = prevSym.getParentScope()->find(name.text)) == nullptr) {

                // Check if we actually had a method prototype found here but it failed
                // to resolve due to some other error, in which case we should keep quiet.
                auto& nameMap = scope.getNameMap();
                if (auto scopeIt = nameMap.find(name.text);
                    scopeIt != nameMap.end() &&
                    scopeIt->second->kind == SymbolKind::MethodPrototype) {
                    return false;
                }

                // Which error we report depends on whether this is an array
                // (in which case the user needs to use an index expression instead
                // of dot access) or just some other symbol that is missing the
                // requested member.
                if (prevSym.kind == SymbolKind::GenerateBlockArray ||
                    prevSym.kind == SymbolKind::InstanceArray) {
                    result.addDiag(*context.scope, diag::DotIntoInstArray, it->dotLocation);
                }
                else {
                    auto& diag = result.addDiag(*context.scope,
                                                diag::CouldNotResolveHierarchicalPath,
                                                it->dotLocation);
                    diag << name.text;
                    diag << name.range;
                }
                return true;
            }

            // Variables, nets, subroutines can only be accessed via the modport.
            // Other symbols aren't permitted in a modport, so they are allowed
            // to be accessed through it as if we had accessed the interface
            // instance itself.
            if (SemanticFacts::isAllowedInModport(symbol->kind) ||
                symbol->kind == SymbolKind::Modport) {
                // This is an error, the modport disallows access.
                auto def = prevSym.getDeclaringDefinition();
                SLANG_ASSERT(def);

                auto& diag = result.addDiag(*context.scope, diag::InvalidModportAccess, name.range);
                diag << name.text;
                diag << def->name;
                diag << prevSym.name;
                return false;
            }
        }
    }

    if (!checkClassParams(name))
        return false;

    if (result.flags.has(LookupResultFlags::IsHierarchical | LookupResultFlags::IfacePort) &&
        symbol) {
        if (result.flags.has(LookupResultFlags::IsHierarchical)) {
            if (VariableSymbol::isKind(symbol->kind) &&
                symbol->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                // If we found an automatic variable check that we didn't try to reference it
                // hierarchically.
                result.addDiag(*context.scope, diag::AutoVariableHierarchical, name.range);
                return false;
            }
            else if (symbol->isType()) {
                // Types cannot be referenced hierarchically.
                result.addDiag(*context.scope, diag::TypeHierarchical, name.range);
                return false;
            }
        }
        result.path.emplace_back(*symbol);
    }

    result.found = symbol;

    if (!name.selectors.empty()) {
        // If this is a scope, the selectors should be an index into it.
        if (result.found && result.found->isScope() && !result.found->isType())
            result.found = Lookup::selectChild(*result.found, name.selectors, context, result);
        else
            result.selectors.append_range(name.selectors);
    }

    return true;
}